

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-base.h
# Opt level: O1

void __thiscall mp::BasicSolver::~BasicSolver(BasicSolver *this)

{
  ~BasicSolver(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

virtual ~BasicSolver() { }